

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_add_page(qpdf_data qpdf,qpdf_data newpage_qpdf,qpdf_oh newpage,QPDF_BOOL first)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_16_2_f78c7dcc local_60;
  function<void_(_qpdf_data_*)> local_50;
  undefined1 local_30 [8];
  QPDFObjectHandle page;
  QPDF_BOOL first_local;
  qpdf_oh newpage_local;
  qpdf_data newpage_qpdf_local;
  qpdf_data qpdf_local;
  
  page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = first;
  page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = newpage;
  QTC::TC("qpdf","qpdf-c called qpdf_add_page",0);
  qpdf_oh_item_internal((qpdf_data)local_30,(qpdf_oh)newpage_qpdf);
  local_60.first =
       (QPDF_BOOL)
       page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_60.page = (QPDFObjectHandle *)local_30;
  std::function<void(_qpdf_data*)>::function<qpdf_add_page::__0,void>
            ((function<void(_qpdf_data*)> *)&local_50,&local_60);
  QVar1 = trap_errors(qpdf,&local_50);
  std::function<void_(_qpdf_data_*)>::~function(&local_50);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_add_page(qpdf_data qpdf, qpdf_data newpage_qpdf, qpdf_oh newpage, QPDF_BOOL first)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_add_page");
    auto page = qpdf_oh_item_internal(newpage_qpdf, newpage);
    return trap_errors(qpdf, [&page, first](qpdf_data q) { q->qpdf->addPage(page, first); });
}